

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_normalize_62
               (secp256k1_modinv64_signed62 *r,int64_t sign,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int64_t cond_add;
  int64_t cond_negate;
  
  lVar15 = r->v[0];
  lVar1 = r->v[1];
  lVar2 = r->v[2];
  lVar3 = r->v[3];
  lVar4 = r->v[4];
  lVar7 = 0;
  do {
    if (r->v[lVar7] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014a7d3:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014a7d8;
    }
    if (0x3fffffffffffffff < r->v[lVar7]) goto LAB_0014a7d3;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  iVar6 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,-2);
  if (iVar6 < 1) {
LAB_0014a7d8:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014a7dd:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014a7e2:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar6 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,1);
    if (-1 < iVar6) goto LAB_0014a7dd;
    uVar8 = lVar4 >> 0x3f;
    uVar9 = (modinfo->modulus).v[0];
    uVar10 = (modinfo->modulus).v[1];
    uVar11 = (modinfo->modulus).v[2];
    uVar12 = (modinfo->modulus).v[3];
    uVar5 = (modinfo->modulus).v[4];
    uVar17 = sign >> 0x3f;
    uVar13 = ((uVar8 & uVar9) + lVar15 ^ uVar17) - uVar17;
    uVar18 = ((long)uVar13 >> 0x3e) + (((uVar8 & uVar10) + lVar1 ^ uVar17) - uVar17);
    uVar16 = ((long)uVar18 >> 0x3e) + ((lVar2 + (uVar8 & uVar11) ^ uVar17) - uVar17);
    uVar14 = ((long)uVar16 >> 0x3e) + (((uVar8 & uVar12) + lVar3 ^ uVar17) - uVar17);
    lVar15 = ((long)uVar14 >> 0x3e) + (((uVar8 & uVar5) + lVar4 ^ uVar17) - uVar17);
    uVar17 = lVar15 >> 0x3f;
    uVar9 = (uVar9 & uVar17) + (uVar13 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar9 >> 0x3e) + (uVar10 & uVar17) + (uVar18 & 0x3fffffffffffffff);
    uVar10 = ((long)uVar8 >> 0x3e) + (uVar11 & uVar17) + (uVar16 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar10 >> 0x3e) + (uVar12 & uVar17) + (uVar14 & 0x3fffffffffffffff);
    uVar12 = (uVar5 & uVar17) + lVar15 + ((long)uVar11 >> 0x3e);
    r->v[0] = uVar9 & 0x3fffffffffffffff;
    r->v[1] = uVar8 & 0x3fffffffffffffff;
    r->v[2] = uVar10 & 0x3fffffffffffffff;
    r->v[3] = uVar11 & 0x3fffffffffffffff;
    r->v[4] = uVar12;
    if (0x3fffffffffffffff < uVar12) goto LAB_0014a7e2;
    iVar6 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,0);
    if (-1 < iVar6) {
      iVar6 = secp256k1_modinv64_mul_cmp_62(r,5,&modinfo->modulus,1);
      if (iVar6 < 0) {
        return;
      }
      goto LAB_0014a7ec;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014a7ec:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_normalize_62(secp256k1_modinv64_signed62 *r, int64_t sign, const secp256k1_modinv64_modinfo *modinfo) {
    const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    int64_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4];
    volatile int64_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^62,2^62). */
    int i;
    for (i = 0; i < 5; ++i) {
        VERIFY_CHECK(r->v[i] >= -M62);
        VERIFY_CHECK(r->v[i] <= M62);
    }
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^62,2^62), this cannot overflow an int64_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r4 >> 63;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    cond_negate = sign >> 63;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^62,2^62). */
    r1 += r0 >> 62; r0 &= M62;
    r2 += r1 >> 62; r1 &= M62;
    r3 += r2 >> 62; r2 &= M62;
    r4 += r3 >> 62; r3 &= M62;

    /* In a second step add the modulus again if the result is still negative, bringing
     * r to range [0,modulus). */
    cond_add = r4 >> 63;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 62; r0 &= M62;
    r2 += r1 >> 62; r1 &= M62;
    r3 += r2 >> 62; r2 &= M62;
    r4 += r3 >> 62; r3 &= M62;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;

    VERIFY_CHECK(r0 >> 62 == 0);
    VERIFY_CHECK(r1 >> 62 == 0);
    VERIFY_CHECK(r2 >> 62 == 0);
    VERIFY_CHECK(r3 >> 62 == 0);
    VERIFY_CHECK(r4 >> 62 == 0);
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(r, 5, &modinfo->modulus, 1) < 0); /* r < modulus */
}